

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

size_t __thiscall
VulkanHppGenerator::determineInitialSkipCount(VulkanHppGenerator *this,string *command)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  size_t sVar4;
  
  cVar2 = anon_unknown.dwarf_dd40c::findByNameOrAlias<VulkanHppGenerator::CommandData>
                    (&this->m_commands,command);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_commands)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("commandIt != m_commands.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x673,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
          ::find(&(this->m_handles)._M_t,(key_type *)&cVar2._M_node[4]._M_parent);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_handles)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("handleIt != m_handles.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x675,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::contains((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(cVar3._M_node + 5),command);
  if (bVar1) {
    sVar4 = (size_t)(cVar3._M_node[1]._M_parent != (_Base_ptr)0x0);
  }
  else {
    if ((ulong)(((long)cVar2._M_node[5]._M_left - (long)cVar2._M_node[5]._M_parent) / 0x108) < 2) {
      __assert_fail("1 < commandIt->second.params.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x678,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
            ::contains(&this->m_handles,(key_type *)&cVar2._M_node[5]._M_parent[9]._M_parent);
    if (!bVar1) {
      __assert_fail("m_handles.contains( commandIt->second.params[1].type.type )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x679,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
    sVar4 = 2;
  }
  return sVar4;
}

Assistant:

size_t VulkanHppGenerator::determineInitialSkipCount( std::string const & command ) const
{
  // determine the number of arguments to skip for a function
  // -> 0: the command is not bound to an instance or a device (the corresponding handle has no name)
  // -> 1: the command bound to an instance or a device (the corresponding handle has a name)
  // -> 2: the command has been moved to a second handle
  auto commandIt = findByNameOrAlias( m_commands, command );
  assert( commandIt != m_commands.end() );
  auto handleIt = m_handles.find( commandIt->second.handle );
  assert( handleIt != m_handles.end() );
  if ( !handleIt->second.commands.contains( command ) )
  {
    assert( 1 < commandIt->second.params.size() );
    assert( m_handles.contains( commandIt->second.params[1].type.type ) );
    return 2;
  }
  else
  {
    return handleIt->first.empty() ? 0 : 1;
  }
}